

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O2

string * anon_unknown.dwarf_1aacf::getIDLAbsolute
                   (string *__return_storage_ptr__,Type *type,IDLExport *exporter,string *field_name
                   )

{
  string ns;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  base;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  undefined1 local_50 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  getIDLBase((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_50,type,exporter,field_name);
  if (local_50._8_8_ == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(local_50 + 0x20));
  }
  else {
    std::__cxx11::string::string((string *)&local_90,(string *)local_50);
    boost::algorithm::replace_all<std::__cxx11::string,char_const*,char[3]>
              (&local_90,&Typelib::NamespaceMarkString,(char (*) [3])"::");
    normalizeIDLName(&local_70,&local_90);
    std::operator+(__return_storage_ptr__,&local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_50 + 0x20));
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
  }
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)local_50);
  return __return_storage_ptr__;
}

Assistant:

static string getIDLAbsolute(Type const& type, IDLExport const& exporter, std::string const& field_name = std::string())
    {
        pair<string, string> base = getIDLBase(type, exporter, field_name);
        if (!base.first.empty())
        {
            std::string ns = base.first;
            boost::replace_all(ns, Typelib::NamespaceMarkString, "::");
            return normalizeIDLName(ns) + base.second;
        }
        else return base.second;
    }